

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crc32.cpp
# Opt level: O1

uint32_t crc32_8bytes(void *data,size_t length,uint32_t previousCrc32)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  
  uVar3 = ~previousCrc32;
  if (7 < length) {
    do {
      uVar3 = uVar3 ^ *data;
      uVar1 = *(uint *)((long)data + 4);
      data = (void *)((long)data + 8);
      uVar3 = *(uint *)((long)Crc32Lookup[1] + (ulong)(uVar1 >> 0xe & 0x3fc)) ^
              Crc32Lookup[0][uVar1 >> 0x18] ^ Crc32Lookup[2][uVar1 >> 8 & 0xff] ^
              Crc32Lookup[3][uVar1 & 0xff] ^ Crc32Lookup[4][uVar3 >> 0x18] ^
              *(uint *)((long)Crc32Lookup[5] + (ulong)(uVar3 >> 0xe & 0x3fc)) ^
              Crc32Lookup[6][uVar3 >> 8 & 0xff] ^ Crc32Lookup[7][uVar3 & 0xff];
      length = length - 8;
    } while (7 < length);
  }
  if (length != 0) {
    sVar2 = 0;
    do {
      uVar3 = uVar3 >> 8 ^ Crc32Lookup[0][(uint)*(byte *)((long)data + sVar2) ^ uVar3 & 0xff];
      sVar2 = sVar2 + 1;
    } while (length != sVar2);
  }
  return ~uVar3;
}

Assistant:

uint32_t crc32_8bytes(const void* data, size_t length, uint32_t previousCrc32 = 0)
{
  uint32_t crc = ~previousCrc32; // same as previousCrc32 ^ 0xFFFFFFFF
  const uint32_t* current = (const uint32_t*) data;

  // process eight bytes at once (Slicing-by-8)
  while (length >= 8)
  {
#if __BYTE_ORDER == __BIG_ENDIAN
    uint32_t one = *current++ ^ swap(crc);
    uint32_t two = *current++;
    crc = Crc32Lookup[0][ two      & 0xFF] ^
          Crc32Lookup[1][(two>> 8) & 0xFF] ^
          Crc32Lookup[2][(two>>16) & 0xFF] ^
          Crc32Lookup[3][(two>>24) & 0xFF] ^
          Crc32Lookup[4][ one      & 0xFF] ^
          Crc32Lookup[5][(one>> 8) & 0xFF] ^
          Crc32Lookup[6][(one>>16) & 0xFF] ^
          Crc32Lookup[7][(one>>24) & 0xFF];
#else
    uint32_t one = *current++ ^ crc;
    uint32_t two = *current++;
    crc = Crc32Lookup[0][(two>>24) & 0xFF] ^
          Crc32Lookup[1][(two>>16) & 0xFF] ^
          Crc32Lookup[2][(two>> 8) & 0xFF] ^
          Crc32Lookup[3][ two      & 0xFF] ^
          Crc32Lookup[4][(one>>24) & 0xFF] ^
          Crc32Lookup[5][(one>>16) & 0xFF] ^
          Crc32Lookup[6][(one>> 8) & 0xFF] ^
          Crc32Lookup[7][ one      & 0xFF];
#endif

    length -= 8;
  }

  const uint8_t* currentChar = (const uint8_t*) current;
  // remaining 1 to 7 bytes (standard algorithm)
  while (length-- != 0)
    crc = (crc >> 8) ^ Crc32Lookup[0][(crc & 0xFF) ^ *currentChar++];

  return ~crc; // same as crc ^ 0xFFFFFFFF
}